

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O0

int mbedtls_ssl_session_load(mbedtls_ssl_session *session,uchar *buf,size_t len)

{
  int iVar1;
  int ret;
  size_t len_local;
  uchar *buf_local;
  mbedtls_ssl_session *session_local;
  
  iVar1 = ssl_session_load(session,'\0',buf,len);
  if (iVar1 != 0) {
    mbedtls_ssl_session_free(session);
  }
  return iVar1;
}

Assistant:

int mbedtls_ssl_session_load(mbedtls_ssl_session *session,
                             const unsigned char *buf,
                             size_t len)
{
    int ret = ssl_session_load(session, 0, buf, len);

    if (ret != 0) {
        mbedtls_ssl_session_free(session);
    }

    return ret;
}